

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError getnum(long *val,char *str,int base)

{
  int iVar1;
  long lVar2;
  ParameterError PVar3;
  bool bVar4;
  curl_off_t num;
  char *local_30;
  long local_28;
  
  PVar3 = PARAM_BAD_NUMERIC;
  if (str != (char *)0x0) {
    local_30 = str;
    if (base == 10) {
      bVar4 = *str == '-';
      if (bVar4) {
        local_30 = str + 1;
      }
      iVar1 = Curl_str_number(&local_30,&local_28,0x7fffffffffffffff);
      if (iVar1 != 0) {
        return PARAM_BAD_NUMERIC;
      }
    }
    else {
      iVar1 = Curl_str_octal(&local_30,&local_28,0x7fffffffffffffff);
      if (iVar1 != 0) {
        return PARAM_BAD_NUMERIC;
      }
      bVar4 = false;
    }
    iVar1 = Curl_str_single(&local_30,'\0');
    if (iVar1 == 0) {
      lVar2 = -local_28;
      if (!bVar4) {
        lVar2 = local_28;
      }
      *val = lVar2;
      PVar3 = PARAM_OK;
    }
  }
  return PVar3;
}

Assistant:

static ParameterError getnum(long *val, const char *str, int base)
{
  DEBUGASSERT((base == 8) || (base == 10));
  if(str) {
    curl_off_t num;
    bool is_neg = FALSE;
    if(base == 10) {
      is_neg = (*str == '-');
      if(is_neg)
        str++;
      if(curlx_str_number(&str, &num, LONG_MAX))
        return PARAM_BAD_NUMERIC;
    }
    else { /* base == 8 */
      if(curlx_str_octal(&str, &num, LONG_MAX))
        return PARAM_BAD_NUMERIC;
    }
    if(!curlx_str_single(&str, '\0')) {
      *val = (long)num;
      if(is_neg)
        *val = -*val;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}